

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::renderUI(Sandbox *this)

{
  UniformFunctionsMap *pUVar1;
  bool bVar2;
  uint uVar3;
  pointer ppFVar4;
  pointer ppPVar5;
  pointer pFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *_text;
  int iVar8;
  int iVar9;
  WindowStyle WVar10;
  iterator iVar11;
  _Base_ptr p_Var12;
  mapped_type *pmVar13;
  long lVar14;
  Fbo *pFVar15;
  _Rb_tree_node_base *p_Var16;
  mat4 *_value;
  Vbo *pVVar17;
  Vbo *this_00;
  Shader *pSVar18;
  glm *this_01;
  Camera *pCVar19;
  vec<3,_float,_(glm::qualifier)0> *in_RCX;
  char *pcVar20;
  Tracker *this_02;
  char *pcVar21;
  pointer pPVar22;
  _Self __tmp;
  ulong uVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Da;
  float _near;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined8 extraout_XMM0_Qb_00;
  double dVar26;
  float fVar27;
  float fVar28;
  allocator local_1d5;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float fStack_1c4;
  undefined8 uStack_1c0;
  double local_1b8;
  float local_1ac;
  string local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_174;
  undefined1 local_170 [32];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_150;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_14c;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_148;
  undefined1 auStack_144 [20];
  undefined8 uStack_130;
  undefined4 local_128;
  undefined8 local_124;
  undefined8 uStack_11c;
  undefined4 local_114;
  double local_a8;
  Tracker *local_a0;
  float local_94;
  UniformFunctionsMap *local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  this_02 = &(this->uniforms).tracker;
  if ((this->uniforms).tracker.m_running == true) {
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"renderUI",
               (allocator *)&local_1a8);
    Tracker::begin(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                  );
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
  }
  local_a0 = this_02;
  if ((this->m_showTextures == true) &&
     (iVar9 = (int)(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count, 0 < iVar9)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:textures",(allocator *)&local_1a8);
      Tracker::begin(this_02,(string *)
                             (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    iVar8 = vera::getWindowWidth();
    local_174 = (float)iVar8;
    iVar8 = vera::getWindowHeight();
    fVar28 = (float)iVar8;
    dVar26 = (double)(1.0 / (float)iVar9);
    if (0.25 <= dVar26) {
      dVar26 = 0.25;
    }
    local_174 = local_174 * (float)(dVar26 * 0.5) * (fVar28 / local_174);
    local_1d4 = (float)(dVar26 * 0.5) * fVar28;
    _local_1c8 = CONCAT44(fStack_1c4,fVar28 - local_1d4);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textAlign(ALIGN_TOP,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    local_188 = CONCAT44(local_188._4_4_,local_174 * 0.2);
    fVar28 = vera::getPixelDensity(false);
    vera::textSize((float)local_188 / fVar28,(Font *)0x0);
    auVar25._0_8_ = -(double)local_1d4;
    auVar25._8_4_ = (undefined4)extraout_XMM0_Qb;
    auVar25._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
    local_1b8 = (double)local_174 * 0.5;
    uStack_60 = auVar25._8_8_;
    local_68 = auVar25._0_8_ + auVar25._0_8_;
    for (p_Var12 = (this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_left; this_02 = local_a0,
        (_Rb_tree_header *)p_Var12 !=
        &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      iVar9 = (**(code **)(**(long **)(p_Var12 + 2) + 0x60))();
      local_188._0_4_ = (float)iVar9;
      iVar9 = (**(code **)(**(long **)(p_Var12 + 2) + 0x68))();
      local_188 = CONCAT44(local_188._4_4_,((float)local_188 / (float)iVar9) * local_174);
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
               ::find(&(this->uniforms).super_Scene.streams._M_t,(key_type *)(p_Var12 + 1));
      if ((_Rb_tree_header *)iVar11._M_node ==
          &(this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header) {
        vera::image(*(Texture **)(p_Var12 + 2),(float)((double)(float)local_188 * 0.5 + local_1b8),
                    local_1c8,(float)local_188,local_1d4);
      }
      else {
        vera::image(*(TextureStream **)(iVar11._M_node + 2),
                    (float)((double)(float)local_188 * 0.5 + local_1b8),local_1c8,(float)local_188,
                    local_1d4,true);
      }
      iVar9 = vera::getWindowHeight();
      vera::text((string *)(p_Var12 + 1),0.0,((float)iVar9 - local_1c8) - local_1d4,(Font *)0x0);
      _local_1c8 = CONCAT44(fStack_1c4,(float)((double)local_1c8 + local_68));
    }
    if ((this->uniforms).tracker.m_running != false) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:textures",(allocator *)&local_1a8);
      Tracker::end(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                  );
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
  }
  if (this->m_showPasses == true) {
    glDisable(0xb71);
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:buffers",(allocator *)&local_1a8);
      Tracker::begin(this_02,(string *)
                             (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    in_RCX = (vec<3,_float,_(glm::qualifier)0> *)
             (((long)(this->uniforms).pyramids.
                     super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x580 +
             ((long)(this->uniforms).doubleBuffers.
                    super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->uniforms).doubleBuffers.
                    super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) +
             ((long)(this->uniforms).buffers.
                    super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->uniforms).buffers.
                    super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3));
    iVar9 = (int)(((long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->uniforms).floods.
                        super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0xc0) + (int)in_RCX;
    if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"u_scene"
                 ,(allocator *)&local_1a8);
      pUVar1 = &(this->uniforms).functions;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar1,(key_type *)
                                    (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2))
      ;
      bVar24 = pmVar13->present;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "u_sceneDepth",(allocator *)&local_1a8);
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar1,(key_type *)
                                    (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2))
      ;
      iVar9 = (uint)pmVar13->present + (uint)bVar24 + iVar9 + 1;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_sceneNormal",(allocator *)&local_1a8);
    pUVar1 = &(this->uniforms).functions;
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar1,(key_type *)
                                  (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    bVar24 = pmVar13->present;
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_scenePosition",(allocator *)&local_1a8);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar1,(key_type *)
                                  (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    bVar2 = pmVar13->present;
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    iVar9 = iVar9 + (uint)bVar24 + (uint)bVar2 + (int)(this->m_sceneRender).m_buffers_total;
    if (0 < iVar9) {
      local_90 = pUVar1;
      iVar8 = vera::getWindowWidth();
      local_1cc = (float)iVar8;
      iVar8 = vera::getWindowHeight();
      dVar26 = (double)(1.0 / (float)iVar9);
      if (0.25 <= dVar26) {
        dVar26 = 0.25;
      }
      local_1ac = (float)(dVar26 * 0.5) * local_1cc;
      local_1d0 = (float)(dVar26 * 0.5) * (float)iVar8;
      local_1cc = local_1cc - local_1ac;
      local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)iVar8 - local_1d0);
      vera::textAngle(0.0,(Font *)0x0);
      local_1c8 = local_1ac * 0.2;
      fVar28 = vera::getPixelDensity(false);
      vera::textSize(local_1c8 / fVar28,(Font *)0x0);
      vera::textAlign(ALIGN_TOP,(Font *)0x0);
      vera::textAlign(ALIGN_LEFT,(Font *)0x0);
      local_78 = (double)local_1d0;
      local_88._0_8_ = -local_78;
      local_88._8_4_ = (int)extraout_XMM0_Qb_00;
      local_88._12_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ 0x80000000;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
      local_a8 = (double)local_88._0_8_ + (double)local_88._0_8_;
      uStack_70 = extraout_XMM0_Qb_00;
      for (local_170._0_8_ = (pointer)0x0;
          ppFVar4 = (this->uniforms).buffers.
                    super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (ulong)local_170._0_8_ <
          (pointer)((long)(this->uniforms).buffers.
                          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3);
          local_170._0_8_ = local_170._0_8_ + 1) {
        iVar9 = (*ppFVar4[local_170._0_8_]->_vptr_Fbo[5])();
        local_1c8 = (float)iVar9;
        iVar9 = (*(this->uniforms).buffers.
                  super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_170._0_8_]->_vptr_Fbo[6])();
        local_1c8 = (local_1c8 / (float)iVar9) * local_1d0;
        vera::image((this->uniforms).buffers.
                    super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_170._0_8_],
                    (local_1ac - local_1c8) + local_1cc,local_1b8._0_4_,local_1c8,local_1d0);
        vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_170);
        std::operator+(pbVar7,"u_buffer",&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text(pbVar7,local_1cc - local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,
                   (Font *)0x0);
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::~string((string *)&local_1a8);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
      }
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
      for (local_170._0_8_ = (pointer)0x0;
          ppPVar5 = (this->uniforms).doubleBuffers.
                    super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (ulong)local_170._0_8_ <
          (pointer)((long)(this->uniforms).doubleBuffers.
                          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar5 >> 3);
          local_170._0_8_ = local_170._0_8_ + 1) {
        iVar9 = (*ppPVar5[local_170._0_8_]->src->_vptr_Fbo[5])();
        local_1c8 = (float)iVar9;
        iVar9 = (*(this->uniforms).doubleBuffers.
                  super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_170._0_8_]->src->_vptr_Fbo[6])();
        local_1c8 = (local_1c8 / (float)iVar9) * local_1d0;
        vera::image((this->uniforms).doubleBuffers.
                    super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_170._0_8_]->src,
                    (local_1ac - local_1c8) + local_1cc,local_1b8._0_4_,local_1c8,local_1d0);
        vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_170);
        std::operator+(pbVar7,"u_doubleBuffer",&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text(pbVar7,local_1cc - local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,
                   (Font *)0x0);
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::~string((string *)&local_1a8);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
      }
      local_58 = (double)local_1cc;
      local_170._0_8_ = (pointer)0x0;
      local_78 = local_78 * 0.5;
      local_88._0_8_ = (double)local_88._0_8_ * 0.5;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
      while( true ) {
        pPVar22 = (this->uniforms).pyramids.
                  super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar14 = (long)(this->uniforms).pyramids.
                       super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar22;
        if ((pointer)(lVar14 / 0x580) <= (ulong)local_170._0_8_) break;
        iVar9 = (*pPVar22[local_170._0_8_]._vptr_Pyramid[2])
                          (pPVar22 + local_170._0_8_,pPVar22,lVar14 % 0x580);
        pPVar22 = (this->uniforms).pyramids.
                  super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_188._0_4_ = (float)iVar9;
        iVar9 = (*pPVar22[local_170._0_8_]._vptr_Pyramid[3])(pPVar22 + local_170._0_8_);
        local_94 = ((float)local_188 / (float)iVar9) * local_1d0;
        local_1c8 = (local_1ac - local_94) + local_1cc;
        local_50 = (double)local_1b8._0_4_;
        local_48._8_4_ = (int)uStack_70;
        local_48._0_8_ = local_78 + local_50;
        local_48._12_4_ = (int)((ulong)uStack_70 >> 0x20);
        local_68 = (double)local_88._0_8_ + local_50;
        pPVar22 = (this->uniforms).pyramids.
                  super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_188 = CONCAT44(local_188._4_4_,local_94);
        local_94 = local_94 + local_94;
        local_1d4 = local_1d0;
        uVar23 = 0;
        fVar28 = local_1b8._0_4_;
        while( true ) {
          uVar3 = pPVar22[local_170._0_8_].m_depth;
          if (uVar3 * 2 <= uVar23) break;
          local_174 = fVar28;
          pFVar15 = vera::Pyramid::getResult(pPVar22 + local_170._0_8_,(uint)uVar23);
          fVar28 = local_1c8;
          if (uVar3 <= uVar23) {
            fVar28 = local_94 + local_1c8;
          }
          vera::image(pFVar15,fVar28,local_174,(float)local_188,local_1d4);
          pPVar22 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar24 = uVar23 < pPVar22[local_170._0_8_].m_depth;
          dVar26 = local_68;
          if (!bVar24) {
            dVar26 = (double)local_48._0_8_;
          }
          local_1c8 = local_1c8 - (float)local_188;
          local_1d4 = local_1d4 * *(float *)(&DAT_002cf4d8 + (ulong)bVar24 * 4);
          fVar27 = (float)local_188 * *(float *)(&DAT_002cf4d8 + (ulong)bVar24 * 4);
          fVar28 = (float)dVar26;
          local_188 = CONCAT44(local_188._4_4_,fVar27);
          local_1c8 = local_1c8 - fVar27;
          uVar23 = uVar23 + 1;
        }
        vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_170);
        std::operator+(pbVar7,"u_pyramid0",&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text(pbVar7,(float)(local_58 - ((double)(float)local_188 + (double)(float)local_188)),
                   ((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::~string((string *)&local_1a8);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)(local_50 + local_a8));
        local_170._0_8_ = local_170._0_8_ + 1;
      }
      local_170._0_8_ = (pointer)0x0;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
      while( true ) {
        pFVar6 = (this->uniforms).floods.
                 super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = (long)(this->uniforms).floods.
                       super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pFVar6;
        if ((pointer)(lVar14 / 0xc0) <= (ulong)local_170._0_8_) break;
        pFVar15 = pFVar6[local_170._0_8_].super_PingPong.dst;
        iVar9 = (*pFVar15->_vptr_Fbo[5])(pFVar15,pFVar6,lVar14 % 0xc0);
        local_1c8 = (float)iVar9;
        iVar9 = (*((this->uniforms).floods.
                   super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                   super__Vector_impl_data._M_start[local_170._0_8_].super_PingPong.dst)->_vptr_Fbo
                  [6])();
        local_1c8 = (local_1c8 / (float)iVar9) * local_1d0;
        vera::image((this->uniforms).floods.
                    super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                    super__Vector_impl_data._M_start[local_170._0_8_].super_PingPong.dst,
                    (local_1ac - local_1c8) + local_1cc,local_1b8._0_4_,local_1c8,local_1d0);
        vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_170);
        std::operator+(pbVar7,"u_flood",&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text(pbVar7,local_1cc - local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,
                   (Font *)0x0);
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::~string((string *)&local_1a8);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
        local_170._0_8_ = local_170._0_8_ + 1;
      }
      if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      {
        vera::fill(0.0);
        local_1c8 = local_1cc - local_1ac;
        _text = (string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
        for (p_Var16 = (this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var16 !=
            &(this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
          lVar14 = *(long *)(p_Var16 + 2);
          if ((*(char *)(lVar14 + 0x100) == '\x01') && (*(int *)(lVar14 + 0xec) != 0)) {
            vera::imageDepth((Fbo *)(lVar14 + 0xd0),local_1cc,local_1b8._0_4_,local_1ac,local_1d0,
                             *(float *)(lVar14 + 0x20c),*(float *)(lVar14 + 0x208));
            std::__cxx11::string::string((string *)_text,"u_lightShadowMap",(allocator *)&local_1a8)
            ;
            iVar9 = vera::getWindowHeight();
            vera::text(_text,local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
            std::__cxx11::string::~string((string *)_text);
            local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8)
                                        );
          }
        }
        vera::fill(1.0);
      }
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "u_scenePosition",(allocator *)&local_1a8);
      pUVar1 = local_90;
      this_02 = local_a0;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_90,(key_type *)
                                      (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2
                                      ));
      bVar24 = pmVar13->present;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      if (bVar24 == true) {
        vera::image(&(this->m_sceneRender).positionFbo,local_1cc,local_1b8._0_4_,local_1ac,local_1d0
                   );
        std::__cxx11::string::string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   "u_scenePosition",(allocator *)&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   local_1cc - local_1ac,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
      }
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "u_sceneNormal",(allocator *)&local_1a8);
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar1,(key_type *)
                                    (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2))
      ;
      bVar24 = pmVar13->present;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      if (bVar24 == false) {
        _local_1c8 = CONCAT44(fStack_1c4,local_1cc - local_1ac);
      }
      else {
        vera::image(&(this->m_sceneRender).normalFbo,local_1cc,local_1b8._0_4_,local_1ac,local_1d0);
        std::__cxx11::string::string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   "u_sceneNormal",(allocator *)&local_1a8);
        iVar9 = vera::getWindowHeight();
        _local_1c8 = CONCAT44(fStack_1c4,local_1cc - local_1ac);
        vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   local_1cc - local_1ac,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
      }
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2);
      for (local_170._0_8_ = (pointer)0x0;
          in_RCX = (vec<3,_float,_(glm::qualifier)0> *)
                   (this->m_sceneRender).buffersFbo.
                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
          (ulong)local_170._0_8_ <
          (pointer)((long)(this->m_sceneRender).buffersFbo.
                          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)in_RCX >> 3);
          local_170._0_8_ = local_170._0_8_ + 1) {
        vera::image(*(Fbo **)(&in_RCX->field_0 + local_170._0_8_ * 2),local_1cc,local_1b8._0_4_,
                    local_1ac,local_1d0);
        vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_170);
        std::operator+(pbVar7,"u_sceneBuffer",&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text(pbVar7,local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::~string((string *)&local_1a8);
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)((double)local_1b8._0_4_ + local_a8));
      }
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"u_scene"
                 ,(allocator *)&local_1a8);
      pUVar1 = local_90;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_90,(key_type *)
                                      (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2
                                      ));
      bVar24 = pmVar13->present;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      if (bVar24 == true) {
        vera::image(&(this->m_sceneRender).renderFbo,local_1cc,local_1b8._0_4_,local_1ac,local_1d0);
        std::__cxx11::string::string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   "u_scene",(allocator *)&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
        local_1b8 = (double)CONCAT44(local_1b8._4_4_,(float)(local_a8 + (double)local_1b8._0_4_));
      }
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "u_sceneDepth",(allocator *)&local_1a8);
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar1,(key_type *)
                                    (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2))
      ;
      bVar24 = pmVar13->present;
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      if (bVar24 == true) {
        vera::fill(0.0);
        pCVar19 = (this->uniforms).super_Scene.activeCamera;
        if (pCVar19 != (Camera *)0x0) {
          (*(pCVar19->super_Node)._vptr_Node[0x4d])();
          local_188 = CONCAT44(local_188._4_4_,extraout_XMM0_Da);
          (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4e])();
          vera::imageDepth(&(this->m_sceneRender).renderFbo,local_1cc,local_1b8._0_4_,local_1ac,
                           local_1d0,(float)local_188,_near);
        }
        std::__cxx11::string::string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   "u_sceneDepth",(allocator *)&local_1a8);
        iVar9 = vera::getWindowHeight();
        vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                   local_1c8,((float)iVar9 - local_1b8._0_4_) - local_1d0,(Font *)0x0);
        std::__cxx11::string::~string
                  ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
        vera::fill(1.0);
      }
    }
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:buffers",(allocator *)&local_1a8);
      Tracker::end(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                  );
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
  }
  if ((this->m_plot != PLOT_OFF) && (this->m_plot_texture != (Texture *)0x0)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:plot_data",(allocator *)&local_1a8);
      Tracker::begin(this_02,(string *)
                             (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    fVar28 = vera::getPixelDensity(false);
    local_1c8 = fVar28;
    iVar9 = vera::getWindowWidth();
    pSVar18 = &this->m_plot_shader;
    vera::Shader::use(pSVar18);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"u_scale",
               (allocator *)&local_1a8);
    fVar28 = local_1c8 * 100.0;
    local_1c8 = local_1c8 * 30.0;
    local_188 = CONCAT44(local_188._4_4_,fVar28);
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               fVar28,local_1c8);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_translate",(allocator *)&local_1a8);
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)iVar9 * 0.5,local_1c8 + 10.0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_resolution",(allocator *)&local_1a8);
    iVar9 = vera::getWindowWidth();
    iVar8 = vera::getWindowHeight();
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)iVar9,(float)iVar8);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_viewport",(allocator *)&local_1a8);
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"u_model",
               (allocator *)local_170);
    local_1a8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_1a8._M_string_length = CONCAT44(local_1a8._M_string_length._4_4_,0x3f800000);
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (vec3 *)&local_1a8);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string((string *)&local_1a8,"u_modelMatrix",(allocator *)local_170);
    local_150.x = 1.0;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    auStack_144._0_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    auStack_144._4_4_ = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    auStack_144._8_4_ = 1.0;
    auStack_144._12_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    auStack_144._16_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    uStack_130 = 0;
    local_128 = 0x3f800000;
    local_124 = 0;
    uStack_11c = 0;
    local_114 = 0x3f800000;
    vera::Shader::setUniform
              (pSVar18,&local_1a8,
               (mat4 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),false);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string((string *)&local_1a8,"u_viewMatrix",(allocator *)local_170);
    local_150.x = 1.0;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    auStack_144._0_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    auStack_144._4_4_ = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    auStack_144._8_4_ = 1.0;
    auStack_144._12_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    auStack_144._16_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    uStack_130 = 0;
    local_128 = 0x3f800000;
    local_124 = 0;
    uStack_11c = 0;
    local_114 = 0x3f800000;
    vera::Shader::setUniform
              (pSVar18,&local_1a8,
               (mat4 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),false);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string((string *)&local_1a8,"u_projectionMatrix",(allocator *)local_170);
    local_150.x = 1.0;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    auStack_144._0_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    auStack_144._4_4_ = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    auStack_144._8_4_ = 1.0;
    auStack_144._12_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    auStack_144._16_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    uStack_130 = 0;
    local_128 = 0x3f800000;
    local_124 = 0;
    uStack_11c = 0;
    local_114 = 0x3f800000;
    vera::Shader::setUniform
              (pSVar18,&local_1a8,
               (mat4 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),false);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_modelViewProjectionMatrix",(allocator *)&local_1a8);
    _value = vera::getOrthoMatrix();
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               _value,false);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "u_plotData",(allocator *)&local_1a8);
    in_RCX = (vec<3,_float,_(glm::qualifier)0> *)0x0;
    vera::Shader::setUniformTexture
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               this->m_plot_texture,0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    pVVar17 = vera::getBillboard();
    vera::Vbo::render(pVVar17,pSVar18);
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:plot_data",(allocator *)&local_1a8);
      Tracker::end(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                  );
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
  }
  if ((this->cursor == true) && (bVar24 = vera::getMouseEntered(), bVar24)) {
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:cursor",(allocator *)&local_1a8);
      Tracker::begin(this_02,(string *)
                             (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    if ((this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
        _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
      this_00 = (Vbo *)operator_new(0x60);
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      local_1a8._M_string_length = local_1a8._M_string_length & 0xffffffff00000000;
      vera::crossMesh((Mesh *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                      (vec3 *)&local_1a8,10.0);
      vera::Vbo::Vbo(this_00,(Mesh *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                    );
      pVVar17 = (this->m_cross_vbo)._M_t.
                super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
      (this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
      _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
      if (pVVar17 != (Vbo *)0x0) {
        (*pVVar17->_vptr_Vbo[1])();
      }
      vera::Mesh::~Mesh((Mesh *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    pSVar18 = vera::getFillShader();
    vera::Shader::use(pSVar18);
    std::__cxx11::string::string((string *)&local_1a8,"u_modelViewProjectionMatrix",&local_1d5);
    this_01 = (glm *)vera::getOrthoMatrix();
    fVar28 = vera::getMouseX();
    _local_1c8 = CONCAT44(fStack_1c4,fVar28);
    fVar28 = vera::getMouseY();
    local_170._0_8_ = CONCAT44(fVar28,(int)_local_1c8);
    local_170._8_4_ = 0.0;
    glm::translate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)
               (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),this_01,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_170,in_RCX);
    vera::Shader::setUniform
              (pSVar18,&local_1a8,
               (mat4 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),false);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"u_color",
               (allocator *)local_170);
    local_1a8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_1a8._M_string_length = 0x3f8000003f800000;
    vera::Shader::setUniform
              (pSVar18,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (vec4 *)&local_1a8);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    vera::Vbo::render((this->m_cross_vbo)._M_t.
                      super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                      super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar18);
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "renderUI:cursor",(allocator *)&local_1a8);
      Tracker::end(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2)
                  );
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
  }
  if ((((this->frag_index == -1) && (this->vert_index == -1)) && (this->geom_index == -1)) &&
     (WVar10 = vera::getWindowStyle(), WVar10 != EMBEDDED)) {
    iVar9 = vera::getWindowWidth();
    iVar8 = vera::getWindowHeight();
    pCVar19 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    local_1c8 = (float)iVar9;
    fStack_1c4 = (float)iVar8;
    local_150.x = local_1c8 * 0.5;
    aStack_14c.y = fStack_1c4 * 0.5;
    local_188 = CONCAT44(aStack_14c,local_150);
    uStack_180 = 0;
    uStack_1c0 = 0;
    local_1a8._M_dataplus._M_p =
         (pointer)CONCAT44((float)iVar8 * -0.05 + (float)iVar8 * -0.05 + fStack_1c4,
                           (float)iVar9 * -0.05 + (float)iVar9 * -0.05 + local_1c8);
    vera::rect((vec2 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (vec2 *)&local_1a8,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_CENTER,(Font *)0x0);
    vera::textSize(38.0,(Font *)0x0);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "Drag & Drop",(allocator *)&local_1a8);
    _local_1c8 = CONCAT44(fStack_1c4,fStack_1c4);
    uStack_1c0 = CONCAT44(fStack_1c4,fStack_1c4);
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,fStack_1c4 * 0.45,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    vera::textSize(22.0,(Font *)0x0);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               ".vert .frag .ply .lst .obj .gltf .glb",(allocator *)&local_1a8);
    this_02 = local_a0;
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8 * 0.55,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    vera::setCamera(pCVar19);
  }
  if (this->help == true) {
    iVar9 = vera::getWindowWidth();
    iVar8 = vera::getWindowHeight();
    pCVar19 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    local_150.x = (float)iVar9 * 0.5;
    aStack_14c.y = (float)iVar8 * 0.5;
    fVar28 = (float)iVar9 * 0.05;
    fStack_1c4 = (float)iVar8 * 0.05;
    local_188 = CONCAT44(fStack_1c4,fVar28 + fVar28);
    uStack_180 = 0;
    local_1c8 = fStack_1c4 * 3.0;
    local_1a8._M_dataplus._M_p =
         (pointer)CONCAT44((float)iVar8 - (fStack_1c4 + fStack_1c4),(float)iVar9 - (fVar28 + fVar28)
                          );
    uStack_1c0._0_4_ = fStack_1c4;
    uStack_1c0._4_4_ = fStack_1c4;
    vera::rect((vec2 *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (vec2 *)&local_1a8,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textSize(22.0,(Font *)0x0);
    local_1d4 = vera::getFontHeight();
    local_1d4 = local_1d4 * 1.5;
    this_02 = local_a0;
    if (this->geom_index != -1) {
      pcVar20 = "show";
      pcVar21 = "show";
      if ((this->m_sceneRender).showAxis != false) {
        pcVar21 = "hide";
      }
      std::__cxx11::string::string((string *)local_170,pcVar21,&local_1d5);
      std::operator+(&local_1a8,"a - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
      ;
      this_02 = local_a0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                     " axis");
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_170);
      if ((this->m_sceneRender).showBBoxes != false) {
        pcVar20 = "hide";
      }
      std::__cxx11::string::string((string *)local_170,pcVar20,&local_1d5);
      std::operator+(&local_1a8,"b - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                     " bounding boxes");
      local_1c8 = local_1c8 + local_1d4;
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_170);
      local_1c8 = local_1c8 + local_1d4;
    }
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "c - hide/show cursor",(allocator *)&local_1a8);
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    local_1c8 = local_1c8 + local_1d4;
    if (this->geom_index != -1) {
      pcVar20 = "enable";
      if ((this->m_sceneRender).dynamicShadows != false) {
        pcVar20 = "disable";
      }
      std::__cxx11::string::string((string *)local_170,pcVar20,&local_1d5);
      std::operator+(&local_1a8,"d - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                     " dynamic shadows");
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "f - hide/show floor",(allocator *)&local_1a8);
      local_1c8 = local_1c8 + local_1d4;
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      local_1c8 = local_1c8 + local_1d4;
    }
    bVar24 = vera::isFullscreen();
    pcVar21 = "enable";
    pcVar20 = "enable";
    if (bVar24) {
      pcVar20 = "disable";
    }
    std::__cxx11::string::string((string *)local_170,pcVar20,&local_1d5);
    std::operator+(&local_1a8,"F - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                   " fullscreen");
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)local_170);
    local_1c8 = local_1c8 + local_1d4;
    if (this->geom_index != -1) {
      pcVar20 = "show";
      if ((this->m_sceneRender).showGrid != false) {
        pcVar20 = "hide";
      }
      std::__cxx11::string::string((string *)local_170,pcVar20,&local_1d5);
      std::operator+(&local_1a8,"g - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                     " grid");
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_170);
      local_1c8 = local_1c8 + local_1d4;
    }
    pcVar20 = "show";
    if (this->help != false) {
      pcVar20 = "hide";
    }
    std::__cxx11::string::string((string *)local_170,pcVar20,&local_1d5);
    std::operator+(&local_1a8,"h - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                   " help");
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "i - hide/show extra info",(allocator *)&local_1a8);
    local_1c8 = local_1c8 + local_1d4;
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "o - open shaders on default editor",(allocator *)&local_1a8);
    local_1c8 = local_1c8 + local_1d4;
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "p - hide/show render passes/buffers",(allocator *)&local_1a8);
    local_1c8 = local_1c8 + local_1d4;
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    local_1c8 = local_1c8 + local_1d4;
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "r - restart stream textures",(allocator *)&local_1a8);
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      local_1c8 = local_1c8 + local_1d4;
    }
    if (this->geom_index != -1) {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "s - hide/show sky",(allocator *)&local_1a8);
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
      local_1c8 = local_1c8 + local_1d4;
    }
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               "t - hide/show loaded textures",(allocator *)&local_1a8);
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    if (this->verbose != false) {
      pcVar21 = "disable";
    }
    std::__cxx11::string::string((string *)local_170,pcVar21,&local_1d5);
    std::operator+(&local_1a8,"v - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),&local_1a8,
                   " verbose");
    local_1c8 = local_1c8 + local_1d4;
    vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
               (float)local_188,local_1c8,(Font *)0x0);
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)local_170);
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      std::__cxx11::string::string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 "space - start/stop stream textures",(allocator *)&local_1a8);
      vera::text((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),
                 (float)local_188,local_1d4 + local_1c8,(Font *)0x0);
      std::__cxx11::string::~string
                ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    }
    vera::setCamera(pCVar19);
    glDisable(0xb71);
  }
  if ((this->uniforms).tracker.m_running == true) {
    std::__cxx11::string::string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2),"renderUI",
               (allocator *)&local_1a8);
    Tracker::end(this_02,(string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
    std::__cxx11::string::~string
              ((string *)(((mat<4,_4,_float,_(glm::qualifier)0> *)local_170)->value + 2));
  }
  return;
}

Assistant:

void Sandbox::renderUI() {
    TRACK_BEGIN("renderUI")

    // // IN PUT TEXTURES
    if (m_showTextures) {      

        int nTotal = uniforms.textures.size();
        if (nTotal > 0) {
            glDisable(GL_DEPTH_TEST);
            TRACK_BEGIN("renderUI:textures")
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float a = h/w;
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale * a;
            float yStep = h * scale;
            float xOffset = xStep;
            float yOffset = h - yStep;
            
            vera::textAngle(0.0);
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));

            for (vera::TexturesMap::iterator it = uniforms.textures.begin(); it != uniforms.textures.end(); it++) {
                float imgAspect = ((float)it->second->getWidth()/(float)it->second->getHeight());
                float imgW = xStep * imgAspect;
                vera::TextureStreamsMap::const_iterator slit = uniforms.streams.find(it->first);
                if ( slit != uniforms.streams.end() )
                    vera::image((vera::TextureStream*)slit->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep, true);
                else 
                    vera::image(it->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep);

                vera::text(it->first, 0, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }
            TRACK_END("renderUI:textures")
        }
    }

    // RESULTING BUFFERS
    if (m_showPasses) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:buffers")

        // DEBUG BUFFERS
        int nTotal = uniforms.buffers.size();
        nTotal += uniforms.doubleBuffers.size();
        nTotal += uniforms.pyramids.size();
        nTotal += uniforms.floods.size();
        if (uniforms.models.size() > 0 ) {
            nTotal += 1;
            nTotal += uniforms.functions["u_scene"].present;
            nTotal += uniforms.functions["u_sceneDepth"].present;
        }
        nTotal += uniforms.functions["u_sceneNormal"].present;
        nTotal += uniforms.functions["u_scenePosition"].present;
        nTotal += m_sceneRender.getBuffersTotal();
        
        if (nTotal > 0) {
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale;
            float yStep = h * scale;
            float xOffset = w - xStep;
            float yOffset = h - yStep;

            vera::textAngle(0.0);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);

            for (size_t i = 0; i < uniforms.buffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.buffers[i]->getWidth()/(float)uniforms.buffers[i]->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.buffers[i], offset.x, offset.y, scale.x, scale.y);
                vera::text("u_buffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.doubleBuffers[i]->src->getWidth()/(float)uniforms.doubleBuffers[i]->src->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.doubleBuffers[i]->src, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_doubleBuffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.pyramids.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.pyramids[i].getWidth()/(float)uniforms.pyramids[i].getHeight());
                float w = scale.x;
                offset.x += xStep - w;
                for (size_t j = 0; j < uniforms.pyramids[i].getDepth() * 2; j++ ) {

                    if (j < uniforms.pyramids[i].getDepth())
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x, offset.y, scale.x, scale.y);
                    else 
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x + w * 2.0f, offset.y, scale.x, scale.y);

                    offset.x -= scale.x;
                    if (j < uniforms.pyramids[i].getDepth()) {
                        scale *= 0.5;
                        offset.y = yOffset - yStep * 0.5;
                    }
                    else {
                        offset.y = yOffset + yStep * 0.5;
                        scale *= 2.0;
                    }
                    offset.x -= scale.x;

                }

                vera::text("u_pyramid0" + vera::toString(i), xOffset - scale.x * 2.0, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;

            }

            for (size_t i = 0; i < uniforms.floods.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.floods[i].dst->getWidth()/(float)uniforms.floods[i].dst->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.floods[i].dst, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_flood" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            if (uniforms.models.size() > 0) {
                vera::fill(0.0);
                for (vera::LightsMap::iterator it = uniforms.lights.begin(); it != uniforms.lights.end(); ++it ) {
                    if ( it->second->getShadowMap()->isAllocated() && it->second->getShadowMap()->getDepthTextureId() ) {
                        vera::imageDepth(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep, it->second->getShadowMapFar(), it->second->getShadowMapNear());
                        // vera::image(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep);
                        vera::text("u_lightShadowMap", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                        yOffset -= yStep * 2.0;
                    }
                }
                vera::fill(1.0);
            }

            if (uniforms.functions["u_scenePosition"].present) {
                vera::image(&m_sceneRender.positionFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scenePosition", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneNormal"].present) {
                vera::image(&m_sceneRender.normalFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneNormal", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < m_sceneRender.buffersFbo.size(); i++) {
                vera::image(m_sceneRender.buffersFbo[i], xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneBuffer" + vera::toString(i), xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_scene"].present) {
                vera::image(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scene", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneDepth"].present) {
                vera::fill(0.0);
                if (uniforms.activeCamera)
                    vera::imageDepth(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep, uniforms.activeCamera->getFarClip(), uniforms.activeCamera->getNearClip());
                vera::text("u_sceneDepth", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
                vera::fill(1.0);
            }
        }
        TRACK_END("renderUI:buffers")
    }

    if (m_plot != PLOT_OFF && m_plot_texture ) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:plot_data")

        float p = vera::getPixelDensity();
        float w = 100 * p;
        float h = 30 * p;
        float x = (float)(vera::getWindowWidth()) * 0.5;
        float y = h + 10;

        m_plot_shader.use();
        m_plot_shader.setUniform("u_scale", w, h);
        m_plot_shader.setUniform("u_translate", x, y);
        m_plot_shader.setUniform("u_resolution", (float)vera::getWindowWidth(), (float)vera::getWindowHeight());
        m_plot_shader.setUniform("u_viewport", w, h);
        m_plot_shader.setUniform("u_model", glm::vec3(1.0f));
        m_plot_shader.setUniform("u_modelMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_viewMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_projectionMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_modelViewProjectionMatrix", vera::getOrthoMatrix());
        m_plot_shader.setUniformTexture("u_plotData", m_plot_texture, 0);
        
        vera::getBillboard()->render(&m_plot_shader);
        TRACK_END("renderUI:plot_data")
    }

    if (cursor && vera::getMouseEntered()) {
        TRACK_BEGIN("renderUI:cursor")
        if (m_cross_vbo == nullptr)
            m_cross_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::crossMesh( glm::vec3(0.0f, 0.0f, 0.0f), 10.0f) ));

        vera::Shader* fill = vera::getFillShader();
        fill->use();
        fill->setUniform("u_modelViewProjectionMatrix", glm::translate(vera::getOrthoMatrix(), glm::vec3(vera::getMouseX(), vera::getMouseY(), 0.0f) ) );
        fill->setUniform("u_color", glm::vec4(1.0f));
        m_cross_vbo->render(fill);
        TRACK_END("renderUI:cursor")
    }

    if (frag_index == -1 && vert_index == -1 && geom_index == -1 && vera::getWindowStyle() != vera::EMBEDDED) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);

        vera::textAngle(0.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_CENTER);

        vera::textSize(38.0f);
        vera::text("Drag & Drop", w * 0.5f, h * 0.45f);

        vera::textSize(22.0f);
        vera::text(".vert .frag .ply .lst .obj .gltf .glb", w * 0.5f, h * 0.55f);

        vera::setCamera(cam);
    }

    if (help) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_LEFT);
        vera::textAngle(0.0f);
        vera::textSize(22.0f);
        yStep = vera::getFontHeight() * 1.5f;

        if (geom_index != -1) {
            vera::text("a - " + std::string( m_sceneRender.showAxis? "hide" : "show" ) + " axis", x, y);
            y += yStep;
            vera::text("b - " + std::string( m_sceneRender.showBBoxes? "hide" : "show" ) + " bounding boxes", x, y);
            y += yStep;
        }

        vera::text("c - hide/show cursor", x, y);
        y += yStep;

        if (geom_index != -1) {
            vera::text("d - " + std::string( m_sceneRender.dynamicShadows? "disable" : "enable" ) + " dynamic shadows", x, y);
            y += yStep;
            vera::text("f - hide/show floor", x, y);
            y += yStep;
        }
        vera::text("F - " + std::string( vera::isFullscreen() ? "disable" : "enable" ) + " fullscreen", x, y);
        y += yStep;
        if (geom_index != -1) {
            vera::text("g - " + std::string( m_sceneRender.showGrid? "hide" : "show" ) + " grid", x, y);
            y += yStep;
        }

        vera::text("h - " + std::string( help? "hide" : "show" ) + " help", x, y);
        y += yStep;
        vera::text("i - hide/show extra info", x, y);
        y += yStep;
        vera::text("o - open shaders on default editor", x, y);
        y += yStep;
        vera::text("p - hide/show render passes/buffers", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("r - restart stream textures", x, y);
            y += yStep;
        }

        if (geom_index != -1) {
            vera::text("s - hide/show sky", x, y);
            y += yStep;
        }

        vera::text("t - hide/show loaded textures", x, y);
        y += yStep;
        vera::text("v - " + std::string( verbose? "disable" : "enable" ) + " verbose", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("space - start/stop stream textures", x, y);
            y += yStep;
        }
        
        vera::setCamera(cam);
        glDisable(GL_DEPTH_TEST);
    }

    TRACK_END("renderUI")
}